

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix-improved.c
# Opt level: O3

void RDFK(LPPSTR *GrpKP,LPPSTR a,UINT n,LPPSTR ta,UINT *count,UINT d)

{
  int *piVar1;
  ulong *puVar2;
  ulong uVar3;
  UINT UVar4;
  LPPSTR ppuVar5;
  ulong *puVar6;
  long lVar7;
  uchar cache [32];
  byte local_58 [40];
  
  uVar3 = 0;
  ppuVar5 = a;
  if ((n & 0xffffffffffffffe0) != 0) {
    do {
      lVar7 = 0;
      do {
        local_58[lVar7] = ppuVar5[lVar7][d];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      lVar7 = 0;
      do {
        count[local_58[lVar7]] = count[local_58[lVar7]] + 1;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      uVar3 = uVar3 + 0x20;
      ppuVar5 = ppuVar5 + 0x20;
    } while (uVar3 < (n & 0xffffffffffffffe0));
  }
  puVar2 = count;
  if (uVar3 < n) {
    do {
      count[a[uVar3][d]] = count[a[uVar3][d]] + 1;
      uVar3 = uVar3 + 1;
    } while (n != uVar3);
  }
  do {
    puVar6 = puVar2;
    puVar2 = puVar6 + 1;
  } while (*puVar6 == 0);
  if (*puVar6 < n) {
    *GrpKP = a;
    lVar7 = 0;
    ppuVar5 = a;
    do {
      ppuVar5 = ppuVar5 + count[lVar7];
      GrpKP[lVar7 + 1] = ppuVar5;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xff);
    memcpy(ta,a,n * 8);
    UVar4 = 0;
    do {
      *GrpKP[ta[UVar4][d]] = ta[UVar4];
      GrpKP[ta[UVar4][d]] = GrpKP[ta[UVar4][d]] + 1;
      UVar4 = UVar4 + 1;
    } while (n != UVar4);
    lVar7 = 0;
    do {
      if (lVar7 != 0) {
        uVar3 = count[lVar7];
        if (uVar3 < 0x15) {
          if (1 < uVar3) {
            insertion_sort(a,(int)uVar3,d);
          }
        }
        else {
          _sp->sa = a;
          _sp->sk = (LPBYTE)0x0;
          _sp->sn = (int)uVar3;
          piVar1 = &_sp->sb;
          _sp = _sp + 1;
          *piVar1 = (int)d + 1;
        }
      }
      a = a + count[lVar7];
      count[lVar7] = 0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xff);
  }
  else {
    if (((long)puVar6 - (long)count & 0x7f8U) == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)((long)puVar6 - (long)count) >> 3 & 0xff;
      if (count[uVar3] < 0x15) {
        if (1 < n) {
          insertion_sort(a,(int)n,d);
        }
      }
      else {
        _sp->sa = a;
        _sp->sk = (LPBYTE)0x0;
        _sp->sn = (int)n;
        piVar1 = &_sp->sb;
        _sp = _sp + 1;
        *piVar1 = (int)d + 1;
      }
    }
    count[uVar3] = 0;
  }
  return;
}

Assistant:

static
void RDFK(LPPSTR* GrpKP, LPPSTR a, UINT n, LPPSTR ta,
		UINT* count, UINT d)
{ /* Read Directly From Keys */
	LPPSTR ak, tc; UINT i, *cptr, gs; unsigned char c=0;
	for (i=0; i<n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j<32; ++j) cache[j] = a[i+j][d];
		for (unsigned j=0; j<32; ++j) ++count[cache[j]];
	}
	for (; i<n; i++) count[a[i][d]]++;
	cptr=&count[AL]; while (*cptr<1) cptr++;
	if (*cptr<n) gs=n;
	else { c=(cptr-&count[AL])+AL; gs=0; }
	if (!gs) {
		if (splittable(c)) push(a, 0, n, d+1);
		else if (n>1 && c>0) insertion_sort(a, n, d);
		count[c]=0; return;
	}
	GrpKP[AL]=a;
	for (ak=a, i=AL; i<AH; i++) GrpKP[i+1]=ak+=count[i];
	memcpy(ta, a, sizeof(LPSTR)*n);
	for (i=0, tc=ta; i<n; i++, tc++) {
		*GrpKP[ta[i][d]]=*tc; GrpKP[ta[i][d]]++;
	}
	for (ak=a, i=AL; i<AH; i++) {
		if (splittable(i)) push(ak, 0, count[i], d+1);
		else if (count[i]>1 && i>0) insertion_sort(ak, count[i], d);
		ak+=count[i]; count[i]=0;
	}
}